

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O3

void __thiscall OpenMD::DirectionalAtom::DirectionalAtom(DirectionalAtom *this,AtomType *dAtomType)

{
  Mat3x3d *__s;
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  int i;
  long lVar4;
  int iVar5;
  double *pdVar6;
  MultipoleAdapter ma;
  Mat3x3d inertiaTensor;
  DirectionalAdapter da;
  MultipoleAdapter local_78;
  Mat3x3d local_70;
  DirectionalAdapter local_28;
  
  Atom::Atom(&this->super_Atom,dAtomType);
  (this->super_Atom).super_StuntDouble._vptr_StuntDouble =
       (_func_int **)&PTR__DirectionalAtom_00225550;
  __s = &this->I_;
  memset(__s,0,0xa8);
  (this->super_Atom).super_StuntDouble.objType_ = otDAtom;
  local_28.at_ = dAtomType;
  DirectionalAdapter::getI(&local_70,&local_28);
  if (__s != &local_70) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)(this->I_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar4 + 0x10) =
           *(undefined8 *)
            ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar4 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar4 + 8);
      puVar1 = (undefined8 *)
               ((long)(__s->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
               + lVar4);
      *puVar1 = *(undefined8 *)
                 ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar4);
      puVar1[1] = uVar2;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
  }
  local_78.at_ = dAtomType;
  bVar3 = MultipoleAdapter::isDipole(&local_78);
  if (bVar3) {
    MultipoleAdapter::getDipole((Vector3d *)&local_70,&local_78);
    if ((Mat3x3d *)&this->dipole_ != &local_70) {
      (this->dipole_).super_Vector<double,_3U>.data_[2] =
           local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
      (this->dipole_).super_Vector<double,_3U>.data_[0] =
           local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
      (this->dipole_).super_Vector<double,_3U>.data_[1] =
           local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    }
  }
  bVar3 = MultipoleAdapter::isQuadrupole(&local_78);
  if (bVar3) {
    MultipoleAdapter::getQuadrupole(&local_70,&local_78);
    if (&this->quadrupole_ != &local_70) {
      lVar4 = 0;
      do {
        *(undefined8 *)
         ((long)(this->quadrupole_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                data_[0] + lVar4 + 0x10) =
             *(undefined8 *)
              ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0] + lVar4 + 0x10);
        uVar2 = *(undefined8 *)
                 ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar4 + 8);
        puVar1 = (undefined8 *)
                 ((long)(this->quadrupole_).super_SquareMatrix<double,_3>.
                        super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4);
        *puVar1 = *(undefined8 *)
                   ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0] + lVar4);
        puVar1[1] = uVar2;
        lVar4 = lVar4 + 0x18;
      } while (lVar4 != 0x48);
    }
  }
  pdVar6 = (double *)&local_70;
  (*(this->super_Atom).super_StuntDouble._vptr_StuntDouble[5])(pdVar6,this);
  lVar4 = 0;
  iVar5 = 0;
  do {
    if (ABS(*pdVar6) < 1e-06) {
      (this->super_Atom).super_StuntDouble.linear_ = true;
      (this->super_Atom).super_StuntDouble.linearAxis_ = (int)lVar4;
      iVar5 = iVar5 + 1;
    }
    lVar4 = lVar4 + 1;
    pdVar6 = pdVar6 + 4;
  } while (lVar4 != 3);
  if (1 < iVar5) {
    memcpy(&painCave,
           "Directional Atom warning.\n\tOpenMD found more than one axis in this directional atom with a vanishing \n\tmoment of inertia."
           ,0x7a);
    painCave.isFatal = 0;
    simError();
  }
  return;
}

Assistant:

DirectionalAtom::DirectionalAtom(AtomType* dAtomType) : Atom(dAtomType) {
    objType_ = otDAtom;

    DirectionalAdapter da = DirectionalAdapter(dAtomType);
    I_                    = da.getI();

    MultipoleAdapter ma = MultipoleAdapter(dAtomType);
    if (ma.isDipole()) { dipole_ = ma.getDipole(); }
    if (ma.isQuadrupole()) { quadrupole_ = ma.getQuadrupole(); }

    // Check if one of the diagonal inertia tensor of this directional
    // atom is zero:
    int nLinearAxis       = 0;
    Mat3x3d inertiaTensor = getI();
    for (int i = 0; i < 3; i++) {
      if (fabs(inertiaTensor(i, i)) < OpenMD::epsilon) {
        linear_     = true;
        linearAxis_ = i;
        ++nLinearAxis;
      }
    }

    if (nLinearAxis > 1) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Directional Atom warning.\n"
          "\tOpenMD found more than one axis in this directional atom with a "
          "vanishing \n"
          "\tmoment of inertia.");
      painCave.isFatal = 0;
      simError();
    }
  }